

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O0

int getopt_create_context(getopt_context_t *ctx,int argc,char **argv,getopt_option_t *opts)

{
  bool bVar1;
  char **local_48;
  int local_3c;
  getopt_option_t *local_38;
  getopt_option_t *opt;
  getopt_option_t *opts_local;
  char **argv_local;
  int argc_local;
  getopt_context_t *ctx_local;
  
  if (argc < 2) {
    local_3c = 0;
  }
  else {
    local_3c = argc + -1;
  }
  ctx->argc = local_3c;
  local_48 = argv;
  if (1 < argc) {
    local_48 = argv + 1;
  }
  ctx->argv = local_48;
  ctx->opts = opts;
  ctx->current_index = 0;
  ctx->current_opt_arg = (char *)0x0;
  ctx->num_opts = 0;
  local_38 = opts;
  while( true ) {
    bVar1 = false;
    if (local_38->name == (char *)0x0) {
      bVar1 = local_38->name_short == 0;
    }
    if (bVar1) break;
    if ((((local_38->value == 0x21) || (local_38->value == 0x3f)) || (local_38->value == 0x2b)) ||
       (local_38->value == -1)) {
      return -1;
    }
    if ((local_38->name != (char *)0x0) && (*local_38->name == '-')) {
      return -1;
    }
    ctx->num_opts = ctx->num_opts + 1;
    local_38 = local_38 + 1;
  }
  return 0;
}

Assistant:

int getopt_create_context( getopt_context_t* ctx, int argc, const char** argv, const getopt_option_t* opts )
{
	ctx->argc            = (argc > 1) ? (argc - 1) : 0; /* stripping away file-name! */
	ctx->argv            = (argc > 1) ? (argv + 1) : argv; /* stripping away file-name! */
	ctx->opts            = opts;
	ctx->current_index   = 0;
	ctx->current_opt_arg = 0x0;

	/* count opts */
	ctx->num_opts = 0;
	const getopt_option_t* opt = opts;
	while( !(opt->name == 0x0 && opt->name_short == 0) )
	{
		if( opt->value == '!' || 
			opt->value == '?' || 
			opt->value == '+' || 
			opt->value == -1)
			return -1;

		if( opt->name )
		{
			if( opt->name[0] == '-' )
				return -1;
		}

		ctx->num_opts++; opt++;
	}

	return 0;
}